

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void QApplicationPrivate::setActiveWindow(QWidget *act)

{
  QWidget *pQVar1;
  QObject *pQVar2;
  undefined1 *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  FocusPolicy FVar7;
  QWidget *pQVar8;
  QGraphicsProxyWidget *pQVar9;
  QStyle *pQVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  QWidget *local_a8;
  undefined1 *puStack_a0;
  QArrayData *local_98;
  long lStack_90;
  ulong local_88;
  QArrayData *local_78;
  long lStack_70;
  ulong local_68;
  QWidget *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (act == (QWidget *)0x0) {
    if (active_window == (QWidget *)0x0) goto LAB_002bc51d;
LAB_002bc0e7:
    bVar5 = true;
    pQVar8 = (QWidget *)0x0;
  }
  else {
    pQVar8 = QWidget::window(act);
    if (active_window == pQVar8) goto LAB_002bc51d;
    if (pQVar8 == (QWidget *)0x0) goto LAB_002bc0e7;
    pQVar9 = QWidget::graphicsProxyWidget(pQVar8);
    if (pQVar9 != (QGraphicsProxyWidget *)0x0) goto LAB_002bc51d;
    bVar5 = false;
  }
  local_78 = (QArrayData *)0x0;
  lStack_70 = 0;
  local_68 = 0;
  local_88 = 0;
  local_98 = (QArrayData *)0x0;
  lStack_90 = 0;
  if (active_window != (QWidget *)0x0) {
    pQVar10 = QApplication::style();
    iVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x17,0,active_window,0);
    if (iVar6 == 0) {
      local_58 = active_window;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)&local_98,0,&local_58);
      QList<QWidget_*>::end((QList<QWidget_*> *)&local_98);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QApplication::topLevelWidgets();
      puVar3 = puStack_50;
      if (local_48 != (undefined1 *)0x0) {
        lVar12 = (long)local_48 << 3;
        lVar13 = 0;
        do {
          pQVar1 = *(QWidget **)(puVar3 + lVar13);
          if (((pQVar1->data->widget_attributes & 0x8000) != 0) &&
             (bVar4 = QWidget::isActiveWindow(pQVar1), bVar4)) {
            local_a8 = pQVar1;
            QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                      ((QPodArrayOps<QWidget*> *)&local_98,local_88,&local_a8);
            QList<QWidget_*>::end((QList<QWidget_*> *)&local_98);
          }
          lVar13 = lVar13 + 8;
        } while (lVar12 != lVar13);
      }
      if (local_58 != (QWidget *)0x0) {
        LOCK();
        *(int *)local_58 = *(int *)local_58 + -1;
        UNLOCK();
        if (*(int *)local_58 == 0) {
          QArrayData::deallocate((QArrayData *)local_58,8,0x10);
        }
      }
    }
  }
  if (focus_widget != (QWidget *)0x0) {
    if ((focus_widget->data->widget_attributes & 0x4000) != 0) {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusAboutToChange,ActiveWindowFocusReason);
    QCoreApplication::sendEvent(&focus_widget->super_QObject,(QEvent *)&local_58);
    QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
  }
  active_window = pQVar8;
  if (!bVar5) {
    pQVar10 = QApplication::style();
    iVar6 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x17,0,active_window,0);
    if (iVar6 == 0) {
      local_58 = active_window;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)&local_78,local_68,&local_58);
      QList<QWidget_*>::end((QList<QWidget_*> *)&local_78);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QApplication::topLevelWidgets();
      puVar3 = puStack_50;
      if (local_48 != (undefined1 *)0x0) {
        lVar13 = (long)local_48 << 3;
        lVar12 = 0;
        do {
          pQVar8 = *(QWidget **)(puVar3 + lVar12);
          if (((pQVar8->data->widget_attributes & 0x8000) != 0) &&
             (bVar5 = QWidget::isActiveWindow(pQVar8), bVar5)) {
            local_a8 = pQVar8;
            QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                      ((QPodArrayOps<QWidget*> *)&local_78,local_68,&local_a8);
            QList<QWidget_*>::end((QList<QWidget_*> *)&local_78);
          }
          lVar12 = lVar12 + 8;
        } while (lVar13 != lVar12);
      }
      if (local_58 != (QWidget *)0x0) {
        LOCK();
        *(int *)local_58 = *(int *)local_58 + -1;
        UNLOCK();
        if (*(int *)local_58 == 0) {
          QArrayData::deallocate((QArrayData *)local_58,8,0x10);
        }
      }
    }
  }
  local_58 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_58,ActivationChange);
  local_a8 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_a8,WindowActivate);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_b8,WindowDeactivate);
  if (local_68 != 0) {
    uVar11 = 0;
    do {
      pQVar2 = *(QObject **)(lStack_70 + uVar11 * 8);
      QCoreApplication::sendSpontaneousEvent(pQVar2,(QEvent *)&local_a8);
      QCoreApplication::sendSpontaneousEvent(pQVar2,(QEvent *)&local_58);
      uVar11 = uVar11 + 1;
    } while (uVar11 < local_68);
  }
  if (local_88 != 0) {
    uVar11 = 0;
    do {
      pQVar2 = *(QObject **)(lStack_90 + uVar11 * 8);
      QCoreApplication::sendSpontaneousEvent(pQVar2,(QEvent *)&local_b8);
      QCoreApplication::sendSpontaneousEvent(pQVar2,(QEvent *)&local_58);
      uVar11 = uVar11 + 1;
    } while (uVar11 < local_88);
  }
  lVar12 = QGuiApplicationPrivate::activePopupWindow();
  if (lVar12 == 0) {
    if ((active_window == (QWidget *)0x0) && (focus_widget != (QWidget *)0x0)) {
LAB_002bc46c:
      setFocusWidget((QWidget *)0x0,ActiveWindowFocusReason);
    }
    else if (active_window != (QWidget *)0x0) {
      pQVar8 = QWidget::focusWidget(active_window);
      if ((((pQVar8 == (QWidget *)0x0) || ((pQVar8->data->widget_attributes & 0x8000) == 0)) &&
          (pQVar8 = focusNextPrevChild_helper(active_window,true,(bool *)0x0), pQVar1 = focus_widget
          , pQVar8 == (QWidget *)0x0)) &&
         ((focus_widget != (QWidget *)0x0 ||
          (FVar7 = QWidget::focusPolicy(active_window), pQVar8 = active_window, FVar7 == NoFocus))))
      {
        bVar5 = QWidget::isAncestorOf(active_window,pQVar1);
        if (!bVar5) goto LAB_002bc46c;
      }
      else {
        QWidget::setFocus(pQVar8,ActiveWindowFocusReason);
      }
    }
  }
  QEvent::~QEvent((QEvent *)&local_b8);
  QEvent::~QEvent((QEvent *)&local_a8);
  QEvent::~QEvent((QEvent *)&local_58);
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,8,0x10);
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,8,0x10);
    }
  }
LAB_002bc51d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::setActiveWindow(QWidget* act)
{
    QWidget* window = act?act->window():nullptr;

    if (QApplicationPrivate::active_window == window)
        return;

#if QT_CONFIG(graphicsview)
    if (window && window->graphicsProxyWidget()) {
        // Activate the proxy's view->viewport() ?
        return;
    }
#endif

    QWidgetList toBeActivated;
    QWidgetList toBeDeactivated;

    if (QApplicationPrivate::active_window) {
        if (QApplication::style()->styleHint(QStyle::SH_Widget_ShareActivation, nullptr, QApplicationPrivate::active_window)) {
            const QWidgetList list = QApplication::topLevelWidgets();
            for (auto *w : list) {
                if (w->isVisible() && w->isActiveWindow())
                    toBeDeactivated.append(w);
            }
        } else {
            toBeDeactivated.append(QApplicationPrivate::active_window);
        }
    }

    if (QApplicationPrivate::focus_widget) {
        if (QApplicationPrivate::focus_widget->testAttribute(Qt::WA_InputMethodEnabled))
            QGuiApplication::inputMethod()->commit();

        QFocusEvent focusAboutToChange(QEvent::FocusAboutToChange, Qt::ActiveWindowFocusReason);
        QCoreApplication::sendEvent(QApplicationPrivate::focus_widget, &focusAboutToChange);
    }

    QApplicationPrivate::active_window = window;

    if (QApplicationPrivate::active_window) {
        if (QApplication::style()->styleHint(QStyle::SH_Widget_ShareActivation, nullptr, QApplicationPrivate::active_window)) {
            const QWidgetList list = QApplication::topLevelWidgets();
            for (auto *w : list) {
                if (w->isVisible() && w->isActiveWindow())
                    toBeActivated.append(w);
            }
        } else {
            toBeActivated.append(QApplicationPrivate::active_window);
        }

    }

    // first the activation/deactivation events
    QEvent activationChange(QEvent::ActivationChange);
    QEvent windowActivate(QEvent::WindowActivate);
    QEvent windowDeactivate(QEvent::WindowDeactivate);

    for (int i = 0; i < toBeActivated.size(); ++i) {
        QWidget *w = toBeActivated.at(i);
        QApplication::sendSpontaneousEvent(w, &windowActivate);
        QApplication::sendSpontaneousEvent(w, &activationChange);
    }

    for(int i = 0; i < toBeDeactivated.size(); ++i) {
        QWidget *w = toBeDeactivated.at(i);
        QApplication::sendSpontaneousEvent(w, &windowDeactivate);
        QApplication::sendSpontaneousEvent(w, &activationChange);
    }

    if (!inPopupMode()) {
        // then focus events
        if (!QApplicationPrivate::active_window && QApplicationPrivate::focus_widget) {
            QApplicationPrivate::setFocusWidget(nullptr, Qt::ActiveWindowFocusReason);
        } else if (QApplicationPrivate::active_window) {
            QWidget *w = QApplicationPrivate::active_window->focusWidget();
            if (w && w->isVisible() /*&& w->focusPolicy() != QWidget::NoFocus*/)
                w->setFocus(Qt::ActiveWindowFocusReason);
            else {
                w = QApplicationPrivate::focusNextPrevChild_helper(QApplicationPrivate::active_window, true);
                if (w) {
                    w->setFocus(Qt::ActiveWindowFocusReason);
                } else {
                    w = QApplicationPrivate::focus_widget;
                    if (!w && QApplicationPrivate::active_window->focusPolicy() != Qt::NoFocus) {
                        QApplicationPrivate::active_window->setFocus(Qt::ActiveWindowFocusReason);
                    } else if (!QApplicationPrivate::active_window->isAncestorOf(w)) {
                        // If the focus widget is not in the activate_window, clear the focus
                        QApplicationPrivate::setFocusWidget(nullptr, Qt::ActiveWindowFocusReason);
                    }
                }
            }
        }
    }
}